

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O2

void __thiscall pbrt::SemanticParser::extractTextures(SemanticParser *this,SP *geom,SP *shape)

{
  element_type *peVar1;
  bool bVar2;
  __shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  param;
  undefined1 local_90 [16];
  _Base_ptr local_40;
  
  peVar1 = (shape->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  for (p_Var3 = *(_Base_ptr *)((long)&(peVar1->super_Node).super_ParamSet.param._M_t._M_impl + 0x18)
      ; p_Var3 != (_Rb_tree_node_base *)
                  ((long)&(peVar1->super_Node).super_ParamSet.param._M_t._M_impl + 8U);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
            *)&stack0xffffffffffffffa0,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
            *)(p_Var3 + 1));
    (*(code *)**(undefined8 **)local_40)((SemanticParser *)&stack0xffffffffffffff80);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xffffffffffffff80,"texture");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    if (!bVar2) {
      syntactic::ParamSet::getParamTexture
                ((ParamSet *)local_90,
                 (string *)
                 &(((shape->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_Node).super_ParamSet);
      findOrCreateTexture((SemanticParser *)&stack0xffffffffffffff80,(SP *)this);
      this_00 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
                 ::operator[](&((geom->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->textures,(key_type *)&stack0xffffffffffffffa0)->
                 super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,(__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)
                         &stack0xffffffffffffff80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
             *)&stack0xffffffffffffffa0);
  }
  return;
}

Assistant:

void SemanticParser::extractTextures(Shape::SP geom, pbrt::syntactic::Shape::SP shape)
  {
    for (auto param : shape->param) {
      if (param.second->getType() != "texture")
        continue;

      geom->textures[param.first] = findOrCreateTexture(shape->getParamTexture(param.first));//param.second);
    }
  }